

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgtweak.c
# Opt level: O0

void pParamAll(int sel)

{
  uint local_10;
  uint ii;
  int sel_local;
  
  for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
    if (sel == local_10) {
      pParam(Param + local_10,0x200,' ',' ');
    }
    else {
      pParam(Param + local_10,0x100,' ',' ');
    }
  }
  return;
}

Assistant:

void pParamAll( int sel)
{
	uint	ii;

	// display all settings

	for (ii = 0; ii < sizeof( Param) / sizeof( *Param); ii++)
	{
		if (sel == ii)
			pParam( Param + ii, ATTR_SEL, ' ', ' ');

		else
			pParam( Param + ii, ATTR_DEF, ' ', ' ');
	}
}